

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O0

bool __thiscall Refal2::CVariablesBuilder::checkName(CVariablesBuilder *this,TVariableName name)

{
  TVariableName TVar1;
  int iVar2;
  allocator local_81;
  string local_80 [32];
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [39];
  TVariableName local_19;
  CVariablesBuilder *pCStack_18;
  TVariableName name_local;
  CVariablesBuilder *this_local;
  
  local_19 = name;
  pCStack_18 = this;
  iVar2 = isalnum((uint)name);
  TVar1 = local_19;
  if ((iVar2 == 0) && (local_19 != '_')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,1,TVar1,&local_81);
    std::operator+((char *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "invalid variable name `");
    std::operator+(local_40,(char *)local_60);
    error(this,local_40);
    std::__cxx11::string::~string((string *)local_40);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CVariablesBuilder::checkName( const TVariableName name )
{
	if( ::isalnum( name ) != 0 || name == '_' ) {
		return true;
	}
	error( "invalid variable name `"
		+ std::string( 1, static_cast<char>( name ) )
		+ "`, only letter, digit or `_` allowed as variable name" );
	return false;
}